

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Engine.cpp
# Opt level: O0

StepStatus __thiscall adios2::Engine::BeginStep(Engine *this,StepMode mode,float timeoutSeconds)

{
  StepStatus SVar1;
  undefined4 in_ESI;
  undefined8 *in_RDI;
  undefined4 in_XMM0_Da;
  allocator local_31;
  string local_30 [32];
  undefined4 local_10;
  undefined4 local_c;
  
  local_10 = in_XMM0_Da;
  local_c = in_ESI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_30,"in call to Engine::BeginStep(const StepMode, const float)",&local_31);
  helper::CheckForNullptr<adios2::core::Engine>
            ((Engine *)this,(string *)CONCAT44(mode,timeoutSeconds));
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  SVar1 = (**(code **)(*(long *)*in_RDI + 0x18))(local_10,(long *)*in_RDI,local_c);
  return SVar1;
}

Assistant:

StepStatus Engine::BeginStep(const StepMode mode, const float timeoutSeconds)
{
    helper::CheckForNullptr(m_Engine, "in call to Engine::BeginStep(const StepMode, const float)");
    return m_Engine->BeginStep(mode, timeoutSeconds);
}